

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f3_get_stem_contributions_d53
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  long lVar1;
  undefined2 uVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  vrna_param_t *p;
  code *pcVar6;
  code *pcVar7;
  short *psVar8;
  char **ptype_00;
  char *pcVar9;
  vrna_sc_t *pvVar10;
  short **ppsVar11;
  uint **ppuVar12;
  uchar uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  void *pvVar19;
  int *piVar20;
  void *__ptr;
  int local_e4;
  int local_d8;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int maxdist;
  int length;
  int *stems;
  int *c;
  int turn;
  int max_j;
  int j;
  int energy;
  uint type;
  uint **a2s;
  uint n_seq;
  uint s;
  short *ssi1;
  short sj1;
  short si1;
  short *s5i1;
  short **S3;
  short **S5;
  short **S;
  short *S1;
  char **ptype;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  uVar4 = fc->length;
  iVar18 = fc->window_size;
  p = fc->params;
  lVar1 = *(long *)((fc->matrices->field_2).field_0.c + (long)i * 2 + 2) + -4 + (long)i * -4;
  iVar17 = (p->model_details).min_loop_size;
  pvVar19 = vrna_alloc(iVar18 * 4 + 0x18);
  piVar20 = (int *)((long)pvVar19 + (long)i * -4);
  pcVar6 = (code *)sc_wrapper->decomp_stem1;
  pcVar7 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar8 = (fc->field_23).field_0.sequence_encoding;
    ptype_00 = fc->ptype_local;
    sVar3 = psVar8[i];
    if ((int)(uVar4 - 1) < i + iVar18 + 1) {
      local_d8 = uVar4 - 1;
    }
    else {
      local_d8 = i + iVar18 + 1;
    }
    turn = i + iVar17;
    while (iVar5 = turn, turn = iVar5 + 1, turn <= local_d8) {
      piVar20[turn] = 10000000;
      if ((*(int *)(lVar1 + (long)iVar5 * 4) != 10000000) &&
         (uVar13 = (*evaluate)(i,uVar4,iVar5,iVar5 + 2,'\x14',hc_dat_local), uVar13 != '\0')) {
        uVar14 = vrna_get_ptype_window(i + 1,iVar5,ptype_00);
        iVar5 = *(int *)(lVar1 + (long)iVar5 * 4);
        iVar16 = vrna_E_ext_stem(uVar14,(int)sVar3,(int)psVar8[turn],p);
        piVar20[turn] = iVar5 + iVar16;
      }
    }
    if (pcVar6 != (code *)0x0) {
      turn = i + iVar17;
      while (iVar17 = turn, turn = iVar17 + 1, turn <= local_d8) {
        if (piVar20[turn] != 10000000) {
          iVar17 = (*pcVar6)(i,iVar17,iVar17 + 2,sc_wrapper);
          piVar20[turn] = iVar17 + piVar20[turn];
        }
      }
    }
    if ((((int)uVar4 <= i + iVar18) && (*(int *)(lVar1 + (long)(int)(uVar4 - 1) * 4) != 10000000))
       && (uVar13 = (*evaluate)(i,uVar4,i + 1,uVar4 - 1,'\x0e',hc_dat_local), uVar13 != '\0')) {
      uVar14 = vrna_get_ptype_window(i + 1,uVar4 - 1,ptype_00);
      iVar18 = *(int *)(lVar1 + (long)(int)(uVar4 - 1) * 4);
      iVar17 = vrna_E_ext_stem(uVar14,(int)sVar3,(int)psVar8[(int)uVar4],p);
      piVar20[(int)uVar4] = iVar18 + iVar17;
      if (pcVar7 != (code *)0x0) {
        iVar18 = (*pcVar7)(i,i + 1,uVar4 - 1,sc_wrapper);
        piVar20[(int)uVar4] = iVar18 + piVar20[(int)uVar4];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar14 = (fc->field_23).field_1.n_seq;
    pcVar9 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar10 = (fc->field_23).field_0.sc;
    ppsVar11 = (fc->field_23).field_1.S3;
    ppuVar12 = (fc->field_23).field_1.a2s;
    if ((int)(uVar4 - 1) < i + iVar18 + 1) {
      local_e4 = uVar4 - 1;
    }
    else {
      local_e4 = i + iVar18 + 1;
    }
    pvVar19 = vrna_alloc(uVar14 << 1);
    __ptr = vrna_alloc(uVar14 << 1);
    for (a2s._4_4_ = 0; a2s._4_4_ < uVar14; a2s._4_4_ = a2s._4_4_ + 1) {
      if (ppuVar12[a2s._4_4_][i + 1] < 2) {
        uVar2 = 0xffff;
      }
      else {
        uVar2 = *(undefined2 *)
                 (*(long *)(&pvVar10->type + (ulong)a2s._4_4_ * 2) + (long)(i + 1) * 2);
      }
      *(undefined2 *)((long)pvVar19 + (ulong)a2s._4_4_ * 2) = uVar2;
      *(undefined2 *)((long)__ptr + (ulong)a2s._4_4_ * 2) =
           *(undefined2 *)(*(long *)(pcVar9 + (ulong)a2s._4_4_ * 8) + (long)(i + 1) * 2);
    }
    turn = i + iVar17;
    while (iVar5 = turn, turn = iVar5 + 1, turn <= local_e4) {
      piVar20[turn] = 10000000;
      if ((*(int *)(lVar1 + (long)iVar5 * 4) != 10000000) &&
         (uVar13 = (*evaluate)(i,uVar4,iVar5,iVar5 + 2,'\x14',hc_dat_local), uVar13 != '\0')) {
        max_j = *(int *)(lVar1 + (long)iVar5 * 4);
        for (a2s._4_4_ = 0; a2s._4_4_ < uVar14; a2s._4_4_ = a2s._4_4_ + 1) {
          uVar15 = vrna_get_ptype_md((int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),
                                     (int)*(short *)(*(long *)(pcVar9 + (ulong)a2s._4_4_ * 8) +
                                                    (long)iVar5 * 2),&p->model_details);
          if (ppuVar12[a2s._4_4_][iVar5] < ppuVar12[a2s._4_4_][(int)uVar4]) {
            sVar3 = ppsVar11[a2s._4_4_][iVar5];
          }
          else {
            sVar3 = -1;
          }
          iVar16 = vrna_E_ext_stem(uVar15,(int)*(short *)((long)pvVar19 + (ulong)a2s._4_4_ * 2),
                                   (int)sVar3,p);
          max_j = iVar16 + max_j;
        }
        piVar20[turn] = max_j;
      }
    }
    if (pcVar6 != (code *)0x0) {
      turn = i + iVar17;
      while (iVar17 = turn, turn = iVar17 + 1, turn <= local_e4) {
        if (piVar20[turn] != 10000000) {
          iVar17 = (*pcVar6)(i,iVar17,iVar17 + 2,sc_wrapper);
          piVar20[turn] = iVar17 + piVar20[turn];
        }
      }
    }
    if ((((int)uVar4 <= i + iVar18) && (*(int *)(lVar1 + (long)(int)(uVar4 - 1) * 4) != 10000000))
       && (uVar13 = (*evaluate)(i,uVar4,i + 1,uVar4 - 1,'\x0e',hc_dat_local), uVar13 != '\0')) {
      max_j = *(int *)(lVar1 + (long)(int)(uVar4 - 1) * 4);
      for (a2s._4_4_ = 0; a2s._4_4_ < uVar14; a2s._4_4_ = a2s._4_4_ + 1) {
        uVar15 = vrna_get_ptype_md((int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),
                                   (int)*(short *)(*(long *)(pcVar9 + (ulong)a2s._4_4_ * 8) +
                                                  (long)(int)(uVar4 - 1) * 2),&p->model_details);
        if (ppuVar12[a2s._4_4_][(int)(uVar4 - 1)] < ppuVar12[a2s._4_4_][(int)uVar4]) {
          sVar3 = ppsVar11[a2s._4_4_][(int)(uVar4 - 1)];
        }
        else {
          sVar3 = -1;
        }
        iVar18 = vrna_E_ext_stem(uVar15,(int)*(short *)((long)pvVar19 + (ulong)a2s._4_4_ * 2),
                                 (int)sVar3,p);
        max_j = iVar18 + max_j;
      }
      if (pcVar7 != (code *)0x0) {
        iVar18 = (*pcVar7)(i,i + 1,uVar4 - 1,sc_wrapper);
        max_j = iVar18 + max_j;
      }
      piVar20[(int)uVar4] = max_j;
    }
    free(pvVar19);
    free(__ptr);
  }
  return piVar20;
}

Assistant:

int *
f3_get_stem_contributions_d53(vrna_fold_compound_t      *fc,
                              int                       i,
                              vrna_callback_hc_evaluate *evaluate,
                              struct default_data       *hc_dat_local,
                              struct sc_wrapper_f3      *sc_wrapper)
{
  char                    **ptype;
  short                   *S1, **S, **S5, **S3, *s5i1, si1, sj1, *ssi1;
  unsigned int            s, n_seq, **a2s, type;
  int                     energy, j, max_j, turn, *c, *stems, length, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = (int)fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i + 1];
  c       -= i + 1;
  turn    = md->min_loop_size;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem1;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S1    = fc->sequence_encoding;
      ptype = fc->ptype_local;
      si1   = S1[i];
      max_j = MIN2(length - 1, i + maxdist + 1);

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j - 1] != INF) &&
            (evaluate(i, length, j - 1, j + 1, VRNA_DECOMP_EXT_STEM_EXT1, hc_dat_local))) {
          type      = vrna_get_ptype_window(i + 1, j - 1, ptype);
          stems[j]  = c[j - 1] +
                      vrna_E_ext_stem(type, si1, S1[j], P);
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j - 1, j + 1, sc_wrapper);

      if (length <= i + maxdist) {
        j = length;
        if ((c[j - 1] != INF) &&
            (evaluate(i, length, i + 1, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          type      = vrna_get_ptype_window(i + 1, j - 1, ptype);
          stems[j]  = c[j - 1] +
                      vrna_E_ext_stem(type, si1, S1[j], P);

          if (sc_red_stem)
            stems[j] += sc_red_stem(i, i + 1, j - 1, sc_wrapper);
        }
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      S     = fc->S;
      S5    = fc->S5;
      S3    = fc->S3;
      a2s   = fc->a2s;
      max_j = MIN2(length - 1, i + maxdist + 1);

      s5i1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      ssi1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++) {
        s5i1[s] = (a2s[s][i + 1] > 1) ? S5[s][i + 1] : -1;
        ssi1[s] = S[s][i + 1];
      }

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j - 1] != INF) &&
            (evaluate(i, length, j - 1, j + 1, VRNA_DECOMP_EXT_STEM_EXT1, hc_dat_local))) {
          energy = c[j - 1];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(ssi1[s], S[s][j - 1], md);
            sj1     = (a2s[s][j - 1] < a2s[s][length]) ? S3[s][j - 1] : -1;
            energy  += vrna_E_ext_stem(type, s5i1[s], sj1, P);
          }
          stems[j] = energy;
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j - 1, j + 1, sc_wrapper);

      if (length <= i + maxdist) {
        j = length;
        if ((c[j - 1] != INF) &&
            (evaluate(i, length, i + 1, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          energy = c[j - 1];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(ssi1[s], S[s][j - 1], md);
            sj1     = (a2s[s][j - 1] < a2s[s][length]) ? S3[s][j - 1] : -1;
            energy  += vrna_E_ext_stem(type, s5i1[s], sj1, P);
          }

          if (sc_red_stem)
            energy += sc_red_stem(i, i + 1, j - 1, sc_wrapper);

          stems[j] = energy;
        }
      }

      free(s5i1);
      free(ssi1);

      break;
  }

  return stems;
}